

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O2

int __thiscall deqp::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  GLSLVersion GVar2;
  BufferMode BVar3;
  TestContext *pTVar4;
  Context *pCVar5;
  int iVar6;
  _Alloc_hider _Var7;
  int extraout_EAX;
  TestNode *pTVar8;
  char *pcVar9;
  TestNode *pTVar10;
  long lVar11;
  TestNode *pTVar12;
  BlockSingleStructCase *this_00;
  BlockSingleStructArrayCase *this_01;
  BlockSingleNestedStructCase *this_02;
  BlockSingleNestedStructArrayCase *this_03;
  BlockMultiBasicTypesCase *pBVar13;
  BlockMultiNestedStructCase *pBVar14;
  int isArray;
  uint uVar15;
  anon_struct_16_2_f7718127 *paVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  TestNode *local_c0;
  anon_struct_16_2_f7718127 *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  TestNode *local_50;
  VarType local_48;
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar20 = 0;
  local_50 = pTVar8;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar20 == 3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar4,init::layoutFlags[lVar20].name,
               glcts::fixed_sample_locations_values + 1);
    local_c0 = (TestNode *)(init::layoutFlags + lVar20);
    tcu::TestNode::addChild(local_50,pTVar8);
    paVar16 = (anon_struct_16_2_f7718127 *)0x0;
    while (paVar16 != (anon_struct_16_2_f7718127 *)0x19) {
      DVar1 = init::basicTypes[(long)paVar16];
      pcVar9 = glu::getDataTypeName(DVar1);
      uVar15 = ((uint)paVar16 & 1) * 0x100 + 0x100;
      if ((*(uint *)&local_c0->m_testCtx & 0x10) == 0) {
        uVar15 = 0x300;
      }
      uVar15 = uVar15 | *(uint *)&local_c0->m_testCtx;
      local_b8 = paVar16;
      if (DVar1 - TYPE_BOOL < 4) {
        pTVar10 = (TestNode *)operator_new(0xb0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        GVar2 = this->m_glslVersion;
        ub::VarType::VarType((VarType *)&name,DVar1,0);
        BlockBasicTypeCase::BlockBasicTypeCase
                  ((BlockBasicTypeCase *)pTVar10,pCVar5,pcVar9,
                   glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar15,0);
        tcu::TestNode::addChild(pTVar8,pTVar10);
        ub::VarType::~VarType((VarType *)&name);
      }
      else {
        lVar11 = 8;
        while( true ) {
          if (lVar11 == 0x38) break;
          pTVar10 = (TestNode *)operator_new(0xb0);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,*(char **)((long)&PTR_iterate_01e06d88 + lVar11),
                     (allocator<char> *)&local_70);
          std::operator+(&local_e8,&local_b0,"_");
          std::operator+(&name,&local_e8,pcVar9);
          _Var7 = name._M_dataplus;
          GVar2 = this->m_glslVersion;
          ub::VarType::VarType
                    ((VarType *)&local_90,DVar1,
                     *(deUint32 *)((long)&init::precisionFlags[0].name + lVar11));
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar10,pCVar5,_Var7._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&local_90,uVar15,0);
          tcu::TestNode::addChild(pTVar8,pTVar10);
          ub::VarType::~VarType((VarType *)&local_90);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_b0);
          lVar11 = lVar11 + 0x10;
        }
      }
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          lVar19 = 8;
          while( true ) {
            if (lVar19 == 0x38) break;
            pTVar10 = (TestNode *)operator_new(0xb0);
            pCVar5 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,init::matrixFlags[lVar11].name,&local_c1);
            std::operator+(&local_90,&local_70,"_");
            std::operator+(&local_b0,&local_90,*(char **)((long)&PTR_iterate_01e06d88 + lVar19));
            std::operator+(&local_e8,&local_b0,"_");
            std::operator+(&name,&local_e8,pcVar9);
            _Var7 = name._M_dataplus;
            GVar2 = this->m_glslVersion;
            ub::VarType::VarType
                      (&local_48,DVar1,*(deUint32 *)((long)&init::precisionFlags[0].name + lVar19));
            BlockBasicTypeCase::BlockBasicTypeCase
                      ((BlockBasicTypeCase *)pTVar10,pCVar5,_Var7._M_p,
                       glcts::fixed_sample_locations_values + 1,GVar2,&local_48,
                       init::matrixFlags[lVar11].flags | uVar15,0);
            tcu::TestNode::addChild(pTVar8,pTVar10);
            ub::VarType::~VarType(&local_48);
            std::__cxx11::string::~string((string *)&name);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_70);
            lVar19 = lVar19 + 0x10;
          }
        }
      }
      paVar16 = (anon_struct_16_2_f7718127 *)((long)&local_b8->name + 1);
    }
    lVar20 = lVar20 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar4,"single_basic_array",
             "Single basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  paVar16 = (anon_struct_16_2_f7718127 *)0x0;
  while( true ) {
    pTVar10 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (paVar16 == (anon_struct_16_2_f7718127 *)0x3) break;
    local_c0 = (TestNode *)paVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar10,pTVar4,init::layoutFlags[(long)paVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_b8 = init::layoutFlags + (long)paVar16;
    tcu::TestNode::addChild(pTVar8,pTVar10);
    for (lVar20 = 0; lVar20 != 0x19; lVar20 = lVar20 + 1) {
      DVar1 = init::basicTypes[lVar20];
      pcVar9 = glu::getDataTypeName(DVar1);
      uVar15 = local_b8->flags;
      uVar18 = ((uint)lVar20 & 1) * 0x100 + 0x100;
      if ((uVar15 & 0x10) == 0) {
        uVar18 = 0x300;
      }
      pTVar12 = (TestNode *)operator_new(0xb0);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      GVar2 = this->m_glslVersion;
      ub::VarType::VarType((VarType *)&local_e8,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      ub::VarType::VarType((VarType *)&name,(VarType *)&local_e8,3);
      uVar18 = uVar18 | uVar15;
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)pTVar12,pCVar5,pcVar9,
                 glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar18,0);
      tcu::TestNode::addChild(pTVar10,pTVar12);
      ub::VarType::~VarType((VarType *)&name);
      ub::VarType::~VarType((VarType *)&local_e8);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar11 = 0;
        while( true ) {
          if (lVar11 == 0x20) break;
          pTVar12 = (TestNode *)operator_new(0xb0);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,*(char **)((long)&init::matrixFlags[0].name + lVar11),
                     (allocator<char> *)&local_48);
          std::operator+(&local_e8,&local_b0,"_");
          std::operator+(&name,&local_e8,pcVar9);
          _Var7 = name._M_dataplus;
          GVar2 = this->m_glslVersion;
          ub::VarType::VarType((VarType *)&local_70,DVar1,4);
          ub::VarType::VarType((VarType *)&local_90,(VarType *)&local_70,3);
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar12,pCVar5,_Var7._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&local_90,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar11) | uVar18,0);
          tcu::TestNode::addChild(pTVar10,pTVar12);
          ub::VarType::~VarType((VarType *)&local_90);
          ub::VarType::~VarType((VarType *)&local_70);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_b0);
          lVar11 = lVar11 + 0x10;
        }
      }
    }
    paVar16 = (anon_struct_16_2_f7718127 *)((long)&local_c0->_vptr_TestNode + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pTVar4,"single_struct","Single struct in uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar10);
  for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
    pcVar9 = init::bufferModes[lVar20].name;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      iVar17 = 0;
      while( true ) {
        if (iVar17 == 2) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,pcVar9,(allocator<char> *)&local_90);
        std::operator+(&local_e8,&local_b0,"_");
        std::operator+(&name,&local_e8,init::layoutFlags[lVar11].name);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_b0);
        uVar15 = init::layoutFlags[lVar11].flags;
        BVar3 = init::bufferModes[lVar20].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar17 != 0) {
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          this_00 = (BlockSingleStructCase *)operator_new(0xb8);
          BlockSingleStructCase::BlockSingleStructCase
                    (this_00,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,
                     (uint)((uVar15 & 0x10) == 0) << 9 | uVar15 | 0x100,BVar3,
                     (uint)(iVar17 != 0) * 3);
          tcu::TestNode::addChild(pTVar10,(TestNode *)this_00);
        }
        std::__cxx11::string::~string((string *)&name);
        iVar17 = iVar17 + 1;
      }
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
    pcVar9 = init::bufferModes[lVar20].name;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      iVar17 = 0;
      while( true ) {
        if (iVar17 == 2) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,pcVar9,(allocator<char> *)&local_90);
        std::operator+(&local_e8,&local_b0,"_");
        std::operator+(&name,&local_e8,init::layoutFlags[lVar11].name);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_b0);
        uVar15 = init::layoutFlags[lVar11].flags;
        BVar3 = init::bufferModes[lVar20].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar17 != 0) {
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          this_01 = (BlockSingleStructArrayCase *)operator_new(0xb8);
          BlockSingleStructArrayCase::BlockSingleStructArrayCase
                    (this_01,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,
                     (uint)((uVar15 & 0x10) == 0) << 8 | uVar15 | 0x200,BVar3,
                     (uint)(iVar17 != 0) * 3);
          tcu::TestNode::addChild(pTVar8,(TestNode *)this_01);
        }
        std::__cxx11::string::~string((string *)&name);
        iVar17 = iVar17 + 1;
      }
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct","Nested struct in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
    pcVar9 = init::bufferModes[lVar20].name;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      iVar17 = 0;
      while( true ) {
        if (iVar17 == 2) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,pcVar9,(allocator<char> *)&local_90);
        std::operator+(&local_e8,&local_b0,"_");
        std::operator+(&name,&local_e8,init::layoutFlags[lVar11].name);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_b0);
        uVar15 = init::layoutFlags[lVar11].flags;
        BVar3 = init::bufferModes[lVar20].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar17 != 0) {
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          this_02 = (BlockSingleNestedStructCase *)operator_new(0xb8);
          BlockSingleNestedStructCase::BlockSingleNestedStructCase
                    (this_02,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,
                     (uint)((uVar15 & 0x10) == 0) << 9 | uVar15 | 0x100,BVar3,
                     (uint)(iVar17 != 0) * 3);
          tcu::TestNode::addChild(pTVar8,(TestNode *)this_02);
        }
        std::__cxx11::string::~string((string *)&name);
        iVar17 = iVar17 + 1;
      }
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct_array","Nested struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
    pcVar9 = init::bufferModes[lVar20].name;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      iVar17 = 0;
      while( true ) {
        if (iVar17 == 2) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,pcVar9,(allocator<char> *)&local_90);
        std::operator+(&local_e8,&local_b0,"_");
        std::operator+(&name,&local_e8,init::layoutFlags[lVar11].name);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_b0);
        uVar15 = init::layoutFlags[lVar11].flags;
        BVar3 = init::bufferModes[lVar20].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar17 != 0) {
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          this_03 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
          BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                    (this_03,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,
                     (uint)((uVar15 & 0x10) == 0) << 8 | uVar15 | 0x200,BVar3,
                     (uint)(iVar17 != 0) * 3);
          tcu::TestNode::addChild(pTVar8,(TestNode *)this_03);
        }
        std::__cxx11::string::~string((string *)&name);
        iVar17 = iVar17 + 1;
      }
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "instance_array_basic_type","Single basic variable in instance array");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar20 = 0;
  local_c0 = pTVar8;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar20 == 3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar4,init::layoutFlags[lVar20].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(local_c0,pTVar8);
    local_b8 = init::layoutFlags + lVar20;
    for (lVar11 = 0; paVar16 = local_b8, lVar11 != 0x19; lVar11 = lVar11 + 1) {
      DVar1 = init::basicTypes[lVar11];
      pcVar9 = glu::getDataTypeName(DVar1);
      uVar15 = paVar16->flags;
      uVar18 = ((uint)lVar11 & 1) * 0x100 + 0x100;
      if ((uVar15 & 0x10) == 0) {
        uVar18 = 0x300;
      }
      pTVar10 = (TestNode *)operator_new(0xb0);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      GVar2 = this->m_glslVersion;
      ub::VarType::VarType((VarType *)&name,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      uVar18 = uVar18 | uVar15;
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)pTVar10,pCVar5,pcVar9,
                 glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar18,3);
      tcu::TestNode::addChild(pTVar8,pTVar10);
      ub::VarType::~VarType((VarType *)&name);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar19 = 0;
        while( true ) {
          if (lVar19 == 0x20) break;
          pTVar10 = (TestNode *)operator_new(0xb0);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,*(char **)((long)&init::matrixFlags[0].name + lVar19),
                     (allocator<char> *)&local_70);
          std::operator+(&local_e8,&local_b0,"_");
          std::operator+(&name,&local_e8,pcVar9);
          _Var7 = name._M_dataplus;
          GVar2 = this->m_glslVersion;
          ub::VarType::VarType((VarType *)&local_90,DVar1,4);
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar10,pCVar5,_Var7._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&local_90,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar19) | uVar18,3);
          tcu::TestNode::addChild(pTVar8,pTVar10);
          ub::VarType::~VarType((VarType *)&local_90);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_b0);
          lVar19 = lVar19 + 0x10;
        }
      }
    }
    lVar20 = lVar20 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar4,"multi_basic_types","Multiple buffers with basic types")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar20 = 0;
  while( true ) {
    pTVar10 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar20 == 2) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar10,pTVar4,init::bufferModes[lVar20].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar8,pTVar10);
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      pcVar9 = init::layoutFlags[lVar11].name;
      iVar17 = 2;
      while (iVar17 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar9,(allocator<char> *)&local_e8);
        uVar15 = init::layoutFlags[lVar11].flags;
        if (iVar17 != 2) {
          std::__cxx11::string::append((char *)&name);
        }
        pBVar13 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_e8,&name,"_mixed");
        BVar3 = init::bufferModes[lVar20].mode;
        iVar6 = (uint)(iVar17 != 2) * 3;
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar13,pCVar5,local_e8._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1
                   ,this->m_glslVersion,uVar15 | 0x100,uVar15 | 0x200,BVar3,iVar6);
        tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar13);
        std::__cxx11::string::~string((string *)&local_e8);
        if ((uVar15 & 0x10) == 0) {
          pBVar13 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_e8,&name,"_both");
          BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                    (pBVar13,pCVar5,local_e8._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,uVar15 | 0x300,
                     uVar15 | 0x300,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar13);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        std::__cxx11::string::~string((string *)&name);
        iVar17 = iVar17 + -1;
      }
    }
    lVar20 = lVar20 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pTVar4,"multi_nested_struct",
             "Multiple buffers with nested structs");
  tcu::TestNode::addChild((TestNode *)this,pTVar10);
  lVar20 = 0;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar20 == 2) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar4,init::bufferModes[lVar20].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar10,pTVar8);
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      pcVar9 = init::layoutFlags[lVar11].name;
      iVar17 = 2;
      while (iVar17 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar9,(allocator<char> *)&local_e8);
        uVar15 = init::layoutFlags[lVar11].flags;
        if (iVar17 != 2) {
          std::__cxx11::string::append((char *)&name);
        }
        pBVar14 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_e8,&name,"_mixed");
        BVar3 = init::bufferModes[lVar20].mode;
        iVar6 = (uint)(iVar17 != 2) * 3;
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar14,pCVar5,local_e8._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1
                   ,this->m_glslVersion,uVar15 | 0x100,uVar15 | 0x200,BVar3,iVar6);
        tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar14);
        std::__cxx11::string::~string((string *)&local_e8);
        if ((uVar15 & 0x10) == 0) {
          pBVar14 = (BlockMultiNestedStructCase *)operator_new(0xc0);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_e8,&name,"_both");
          BlockMultiNestedStructCase::BlockMultiNestedStructCase
                    (pBVar14,pCVar5,local_e8._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,uVar15 | 0x300,
                     uVar15 | 0x300,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar14);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        std::__cxx11::string::~string((string *)&name);
        iVar17 = iVar17 + -1;
      }
    }
    lVar20 = lVar20 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar4,"random","Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"scalar_types",
             "Scalar types only, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x3fc0,
             10,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"vector_types",
             "Scalar and vector types only, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x3fc1,10,0x19);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"basic_types",
             "All basic types, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc3,10
             ,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"basic_arrays",
             "Arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc7,10,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fe3,10,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"nested_structs",
             "Nested structs, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fcb,10,
             100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fcf,10,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7feb,10,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x7fef,10,0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0xffffffff,0x14,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",this->m_glslVersion,BUFFERMODE_SINGLE,0xffffffff,
             0x14,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init(void)
{
	static const glu::DataType basicTypes[] = { glu::TYPE_FLOAT,		glu::TYPE_FLOAT_VEC2,   glu::TYPE_FLOAT_VEC3,
												glu::TYPE_FLOAT_VEC4,   glu::TYPE_INT,			glu::TYPE_INT_VEC2,
												glu::TYPE_INT_VEC3,		glu::TYPE_INT_VEC4,		glu::TYPE_UINT,
												glu::TYPE_UINT_VEC2,	glu::TYPE_UINT_VEC3,	glu::TYPE_UINT_VEC4,
												glu::TYPE_BOOL,			glu::TYPE_BOOL_VEC2,	glu::TYPE_BOOL_VEC3,
												glu::TYPE_BOOL_VEC4,	glu::TYPE_FLOAT_MAT2,   glu::TYPE_FLOAT_MAT3,
												glu::TYPE_FLOAT_MAT4,   glu::TYPE_FLOAT_MAT2X3, glu::TYPE_FLOAT_MAT2X4,
												glu::TYPE_FLOAT_MAT3X2, glu::TYPE_FLOAT_MAT3X4, glu::TYPE_FLOAT_MAT4X2,
												glu::TYPE_FLOAT_MAT4X3 };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} precisionFlags[] = { { "lowp", PRECISION_LOW }, { "mediump", PRECISION_MEDIUM }, { "highp", PRECISION_HIGH } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} layoutFlags[] = { { "shared", LAYOUT_SHARED }, { "packed", LAYOUT_PACKED }, { "std140", LAYOUT_STD140 } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} matrixFlags[] = { { "row_major", LAYOUT_ROW_MAJOR }, { "column_major", LAYOUT_COLUMN_MAJOR } };

	static const struct
	{
		const char*					 name;
		UniformBlockCase::BufferMode mode;
	} bufferModes[] = { { "per_block_buffer", UniformBlockCase::BUFFERMODE_PER_BLOCK },
						{ "single_buffer", UniformBlockCase::BUFFERMODE_SINGLE } };

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				if (glu::isDataTypeBoolOrBVec(type))
					layoutGroup->addChild(new BlockBasicTypeCase(m_context, typeName, "", m_glslVersion,
																 VarType(type, 0), flags, 0 /* no instance array */));
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, precisionFlags[precNdx].flags), flags,
							0 /* no instance array */));
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							layoutGroup->addChild(new BlockBasicTypeCase(
								m_context,
								(string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" +
								 typeName)
									.c_str(),
								"", m_glslVersion, VarType(type, precisionFlags[precNdx].flags),
								flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				const int	 arraySize = 3;
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize), flags,
					0 /* no instance array */));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(VarType(type, PRECISION_HIGH), arraySize),
							flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructGroup->addChild(new BlockSingleStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructArrayGroup->addChild(new BlockSingleStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructGroup->addChild(new BlockSingleNestedStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructArrayGroup->addChild(new BlockSingleNestedStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		   = basicTypes[basicTypeNdx];
				const char*   typeName	 = glu::getDataTypeName(type);
				const int	 numInstances = 3;
				deUint32	  baseFlags	= layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		   = baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), flags, numInstances));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, PRECISION_HIGH), flags | matrixFlags[matFlagNdx].flags,
							numInstances));
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32 allShaders	= FEATURE_VERTEX_BLOCKS | FEATURE_FRAGMENT_BLOCKS | FEATURE_SHARED_BLOCKS;
		const deUint32 allLayouts	= FEATURE_PACKED_LAYOUT | FEATURE_SHARED_LAYOUT | FEATURE_STD140_LAYOUT;
		const deUint32 allBasicTypes = FEATURE_VECTORS | FEATURE_MATRICES;
		const deUint32 unused		 = FEATURE_UNUSED_MEMBERS | FEATURE_UNUSED_UNIFORMS;
		const deUint32 matFlags		 = FEATURE_MATRIX_LAYOUT;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types", "Scalar types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders | allLayouts | unused,
							  10, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types", "Scalar and vector types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | FEATURE_VECTORS, 10, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types", "All basic types, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags, 10, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays", "Arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_ARRAYS, 10, 50);

		createRandomCaseGroup(
			randomGroup, m_context, "basic_instance_arrays", "Basic instance arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_INSTANCE_ARRAYS, 10, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs", "Nested structs, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS, 10, 100);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_arrays", "Nested structs, arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_ARRAYS, 10, 150);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_instance_arrays",
			"Nested structs, instance arrays, per-block buffers", m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_INSTANCE_ARRAYS, 10,
			125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",
							  "Nested structs, instance arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS |
								  FEATURE_ARRAYS | FEATURE_INSTANCE_ARRAYS,
							  10, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers", "All random features, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, ~0u, 20, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer", "All random features, shared buffer",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_SINGLE, ~0u, 20, 250);
	}
}